

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

int mpz_set_str(__mpz_struct *r,char *sp,int base)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  uchar *sp_00;
  mp_limb_t *pmVar8;
  mp_size_t mVar9;
  ulong size;
  int iVar10;
  byte bVar11;
  char *pcVar12;
  char *pcVar13;
  ulong uVar14;
  size_t sn;
  byte *__s;
  mpn_base_info info;
  mpn_base_info local_40;
  
  pcVar13 = sp + -1;
  do {
    pcVar12 = pcVar13;
    bVar1 = pcVar12[1];
    pcVar13 = pcVar12 + 1;
    iVar4 = isspace((uint)bVar1);
  } while (iVar4 != 0);
  uVar14 = (ulong)(bVar1 == 0x2d);
  __s = (byte *)(pcVar13 + uVar14);
  if (base != 0) goto LAB_005ee086;
  if (pcVar13[uVar14] != '0') {
    base = 10;
    goto LAB_005ee086;
  }
  bVar11 = pcVar12[uVar14 + 2];
  if (bVar11 < 0x62) {
    if (bVar11 == 0x42) {
LAB_005ee079:
      __s = (byte *)(pcVar13 + uVar14 + 2);
      base = 2;
      goto LAB_005ee086;
    }
    if (bVar11 == 0x58) {
LAB_005ee06a:
      __s = (byte *)(pcVar13 + uVar14 + 2);
      base = 0x10;
      goto LAB_005ee086;
    }
  }
  else {
    if (bVar11 == 0x62) goto LAB_005ee079;
    if (bVar11 == 0x78) goto LAB_005ee06a;
  }
  base = 8;
LAB_005ee086:
  iVar4 = -1;
  if (*__s == 0) {
    iVar5 = 0;
  }
  else {
    sVar7 = strlen((char *)__s);
    sp_00 = (uchar *)(*gmp_allocate_func)(sVar7);
    iVar4 = 10;
    if (0x24 < base) {
      iVar4 = 0x24;
    }
    bVar11 = *__s;
    if (bVar11 == 0) {
      sn = 0;
    }
    else {
      sn = 0;
      do {
        __s = __s + 1;
        iVar5 = isspace((uint)bVar11);
        iVar10 = 6;
        if (iVar5 == 0) {
          if ((byte)(bVar11 - 0x30) < 10) {
            uVar6 = (uint)(byte)(bVar11 - 0x30);
          }
          else if ((byte)(bVar11 + 0x9f) < 0x1a) {
            uVar6 = (char)(bVar11 + 0x9f) + iVar4;
          }
          else {
            uVar6 = bVar11 - 0x37;
            if (0x19 < (byte)(bVar11 + 0xbf)) {
              uVar6 = base;
            }
          }
          if (uVar6 < (uint)base) {
            sp_00[sn] = (uchar)uVar6;
            sn = sn + 1;
            iVar10 = 0;
          }
          else {
            (*gmp_free_func)(sp_00,sVar7);
            r->_mp_size = 0;
            iVar10 = 1;
          }
        }
        if ((iVar10 != 6) && (iVar10 != 0)) {
          return -1;
        }
        bVar11 = *__s;
      } while (bVar11 != 0);
    }
    if (sn == 0) {
      (*gmp_free_func)(sp_00,sVar7);
      iVar5 = 0;
      iVar4 = -1;
    }
    else {
      uVar6 = mpn_base_power_of_two_p(base);
      if (uVar6 == 0) {
        uVar14 = (ulong)base;
        local_40.exp = 1;
        local_40.bb = uVar14;
        if (-1 < base) {
          do {
            local_40.bb = local_40.bb * uVar14;
            local_40.exp = local_40.exp + 1;
            auVar2._8_8_ = 0;
            auVar2._0_8_ = uVar14;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_40.bb;
          } while (SUB168(auVar2 * auVar3,8) == 0);
        }
        size = ((sn + local_40.exp) - 1) / (ulong)local_40.exp;
        if ((long)r->_mp_alloc < (long)size) {
          pmVar8 = mpz_realloc(r,size);
        }
        else {
          pmVar8 = r->_mp_d;
        }
        mVar9 = mpn_set_str_other(pmVar8,sp_00,sn,uVar14,&local_40);
        iVar4 = (int)mVar9 - (uint)(pmVar8[mVar9 + -1] == 0);
      }
      else {
        uVar14 = uVar6 * sn + 0x3f >> 6;
        if ((long)r->_mp_alloc < (long)uVar14) {
          pmVar8 = mpz_realloc(r,uVar14);
        }
        else {
          pmVar8 = r->_mp_d;
        }
        mVar9 = mpn_set_str_bits(pmVar8,sp_00,sn,uVar6);
        iVar4 = (int)mVar9;
      }
      (*gmp_free_func)(sp_00,sVar7);
      iVar5 = -iVar4;
      if (bVar1 != 0x2d) {
        iVar5 = iVar4;
      }
      iVar4 = 0;
    }
  }
  r->_mp_size = iVar5;
  return iVar4;
}

Assistant:

int
mpz_set_str (mpz_t r, const char *sp, int base)
{
  unsigned bits, value_of_a;
  mp_size_t rn, alloc;
  mp_ptr rp;
  size_t dn, sn;
  int sign;
  unsigned char *dp;

  assert (base == 0 || (base >= 2 && base <= 62));

  while (isspace( (unsigned char) *sp))
    sp++;

  sign = (*sp == '-');
  sp += sign;

  if (base == 0)
    {
      if (sp[0] == '0')
	{
	  if (sp[1] == 'x' || sp[1] == 'X')
	    {
	      base = 16;
	      sp += 2;
	    }
	  else if (sp[1] == 'b' || sp[1] == 'B')
	    {
	      base = 2;
	      sp += 2;
	    }
	  else
	    base = 8;
	}
      else
	base = 10;
    }

  if (!*sp)
    {
      r->_mp_size = 0;
      return -1;
    }
  sn = strlen(sp);
  dp = (unsigned char *) gmp_alloc (sn);

  value_of_a = (base > 36) ? 36 : 10;
  for (dn = 0; *sp; sp++)
    {
      unsigned digit;

      if (isspace ((unsigned char) *sp))
	continue;
      else if (*sp >= '0' && *sp <= '9')
	digit = *sp - '0';
      else if (*sp >= 'a' && *sp <= 'z')
	digit = *sp - 'a' + value_of_a;
      else if (*sp >= 'A' && *sp <= 'Z')
	digit = *sp - 'A' + 10;
      else
	digit = base; /* fail */

      if (digit >= (unsigned) base)
	{
	  gmp_free (dp, sn);
	  r->_mp_size = 0;
	  return -1;
	}

      dp[dn++] = digit;
    }

  if (!dn)
    {
      gmp_free (dp, sn);
      r->_mp_size = 0;
      return -1;
    }
  bits = mpn_base_power_of_two_p (base);

  if (bits > 0)
    {
      alloc = (dn * bits + GMP_LIMB_BITS - 1) / GMP_LIMB_BITS;
      rp = MPZ_REALLOC (r, alloc);
      rn = mpn_set_str_bits (rp, dp, dn, bits);
    }
  else
    {
      struct mpn_base_info info;
      mpn_get_base_info (&info, base);
      alloc = (dn + info.exp - 1) / info.exp;
      rp = MPZ_REALLOC (r, alloc);
      rn = mpn_set_str_other (rp, dp, dn, base, &info);
      /* Normalization, needed for all-zero input. */
      assert (rn > 0);
      rn -= rp[rn-1] == 0;
    }
  assert (rn <= alloc);
  gmp_free (dp, sn);

  r->_mp_size = sign ? - rn : rn;

  return 0;
}